

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O3

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationSeparate
          (BlendMaskStateMachine *this,GLenum rgb,GLenum a)

{
  pointer pBVar1;
  GLenum *pGVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  (*this->gl->blendEquationSeparate)(rgb,a);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->state).
                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1;
  if (lVar3 != 0) {
    pGVar2 = &pBVar1->mode_a;
    uVar4 = 1;
    do {
      pGVar2[-1] = rgb;
      *pGVar2 = a;
      uVar5 = (ulong)uVar4;
      pGVar2 = pGVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)(lVar3 >> 5));
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationSeparate(glw::GLenum rgb, glw::GLenum a)
{
	// all draw buffers
	gl.blendEquationSeparate(rgb, a);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].mode_rgb = rgb;
		state[i].mode_a   = a;
	}
}